

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlCtxtGrowAttrs(xmlParserCtxtPtr ctxt,int nr)

{
  int iVar1;
  xmlChar **ppxVar2;
  int *piVar3;
  
  if (ctxt->atts == (xmlChar **)0x0) {
    ppxVar2 = (xmlChar **)(*xmlMalloc)(0x1b8);
    if (ppxVar2 != (xmlChar **)0x0) {
      ctxt->atts = ppxVar2;
      piVar3 = (int *)(*xmlMalloc)(0x2c);
      if (piVar3 != (int *)0x0) {
        ctxt->attallocs = piVar3;
        ctxt->maxatts = 0x37;
        return 0x37;
      }
    }
  }
  else {
    if (nr + 5 <= ctxt->maxatts) {
      return ctxt->maxatts;
    }
    iVar1 = (nr + 5) * 2;
    ppxVar2 = (xmlChar **)(*xmlRealloc)(ctxt->atts,(long)iVar1 * 8);
    if (ppxVar2 != (xmlChar **)0x0) {
      ctxt->atts = ppxVar2;
      piVar3 = (int *)(*xmlRealloc)(ctxt->attallocs,(long)(iVar1 / 5) << 2);
      if (piVar3 != (int *)0x0) {
        ctxt->attallocs = piVar3;
        ctxt->maxatts = iVar1;
        return iVar1;
      }
    }
  }
  xmlErrMemory(ctxt,(char *)0x0);
  return -1;
}

Assistant:

static int
xmlCtxtGrowAttrs(xmlParserCtxtPtr ctxt, int nr) {
    const xmlChar **atts;
    int *attallocs;
    int maxatts;

    if (ctxt->atts == NULL) {
	maxatts = 55; /* allow for 10 attrs by default */
	atts = (const xmlChar **)
	       xmlMalloc(maxatts * sizeof(xmlChar *));
	if (atts == NULL) goto mem_error;
	ctxt->atts = atts;
	attallocs = (int *) xmlMalloc((maxatts / 5) * sizeof(int));
	if (attallocs == NULL) goto mem_error;
	ctxt->attallocs = attallocs;
	ctxt->maxatts = maxatts;
    } else if (nr + 5 > ctxt->maxatts) {
	maxatts = (nr + 5) * 2;
	atts = (const xmlChar **) xmlRealloc((void *) ctxt->atts,
				     maxatts * sizeof(const xmlChar *));
	if (atts == NULL) goto mem_error;
	ctxt->atts = atts;
	attallocs = (int *) xmlRealloc((void *) ctxt->attallocs,
	                             (maxatts / 5) * sizeof(int));
	if (attallocs == NULL) goto mem_error;
	ctxt->attallocs = attallocs;
	ctxt->maxatts = maxatts;
    }
    return(ctxt->maxatts);
mem_error:
    xmlErrMemory(ctxt, NULL);
    return(-1);
}